

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  IMAP *pIVar1;
  connectdata *conn;
  connectdata *pcVar2;
  imapstate iVar3;
  
  pIVar1 = (data->req).p.imap;
  if (pIVar1 == (IMAP *)0x0) {
    return CURLE_OK;
  }
  conn = data->conn;
  if (status == CURLE_OK) {
    status = CURLE_OK;
    if (((((data->set).field_0x894 & 1) == 0) && (pIVar1->custom == (char *)0x0)) &&
       ((pIVar1->uid != (char *)0x0 ||
        (((pIVar1->mindex != (char *)0x0 || (((data->state).field_0x7c0 & 8) != 0)) ||
         (status = CURLE_OK, (data->set).mimepost.kind != MIMEKIND_NONE)))))) {
      if ((((data->state).field_0x7c0 & 8) == 0) && ((data->set).mimepost.kind == MIMEKIND_NONE)) {
        iVar3 = IMAP_FETCH_FINAL;
        pcVar2 = conn;
      }
      else {
        status = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"%s","");
        if (status != CURLE_OK) goto LAB_0013dc47;
        iVar3 = IMAP_APPEND_FINAL;
        pcVar2 = data->conn;
      }
      (pcVar2->proto).imapc.state = iVar3;
      status = imap_block_statemach(data,conn,false);
    }
  }
  else {
    Curl_conncontrol(conn,1);
  }
LAB_0013dc47:
  (*Curl_cfree)(pIVar1->mailbox);
  pIVar1->mailbox = (char *)0x0;
  (*Curl_cfree)(pIVar1->uidvalidity);
  pIVar1->uidvalidity = (char *)0x0;
  (*Curl_cfree)(pIVar1->uid);
  pIVar1->uid = (char *)0x0;
  (*Curl_cfree)(pIVar1->mindex);
  pIVar1->mindex = (char *)0x0;
  (*Curl_cfree)(pIVar1->section);
  pIVar1->section = (char *)0x0;
  (*Curl_cfree)(pIVar1->partial);
  pIVar1->partial = (char *)0x0;
  (*Curl_cfree)(pIVar1->query);
  pIVar1->query = (char *)0x0;
  (*Curl_cfree)(pIVar1->custom);
  pIVar1->custom = (char *)0x0;
  (*Curl_cfree)(pIVar1->custom_params);
  pIVar1->custom_params = (char *)0x0;
  pIVar1->transfer = PPTRANSFER_BODY;
  return status;
}

Assistant:

static CURLcode imap_done(struct Curl_easy *data, CURLcode status,
                          bool premature)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct IMAP *imap = data->req.p.imap;

  (void)premature;

  if(!imap)
    return CURLE_OK;

  if(status) {
    connclose(conn, "IMAP done with bad status"); /* marked for closure */
    result = status;         /* use the already set error code */
  }
  else if(!data->set.connect_only && !imap->custom &&
          (imap->uid || imap->mindex || data->state.upload ||
          IS_MIME_POST(data))) {
    /* Handle responses after FETCH or APPEND transfer has finished */

    if(!data->state.upload && !IS_MIME_POST(data))
      imap_state(data, IMAP_FETCH_FINAL);
    else {
      /* End the APPEND command first by sending an empty line */
      result = Curl_pp_sendf(data, &conn->proto.imapc.pp, "%s", "");
      if(!result)
        imap_state(data, IMAP_APPEND_FINAL);
    }

    /* Run the state-machine */
    if(!result)
      result = imap_block_statemach(data, conn, FALSE);
  }

  /* Cleanup our per-request based variables */
  Curl_safefree(imap->mailbox);
  Curl_safefree(imap->uidvalidity);
  Curl_safefree(imap->uid);
  Curl_safefree(imap->mindex);
  Curl_safefree(imap->section);
  Curl_safefree(imap->partial);
  Curl_safefree(imap->query);
  Curl_safefree(imap->custom);
  Curl_safefree(imap->custom_params);

  /* Clear the transfer mode for the next request */
  imap->transfer = PPTRANSFER_BODY;

  return result;
}